

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDD.cpp
# Opt level: O1

shared_ptr<HDD> __thiscall
HDD::CreateDisk(HDD *this,string *path,int64_t llTotalBytes_,IDENTIFYDEVICE *pIdentify_,
               bool fOverwrite_)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _func_int **pp_Var2;
  bool bVar3;
  char cVar4;
  HDD *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  shared_ptr<HDD> sVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  
  this->_vptr_HDD = (_func_int **)0x0;
  this->h = 0;
  this->cyls = 0;
  bVar3 = IsHddImage(path);
  _Var5._M_pi = extraout_RDX;
  if (bVar3) {
    this_00 = (HDD *)operator_new(0x298);
    memset(this_00,0,0x298);
    HDD(this_00);
    this_00->_vptr_HDD = (_func_int **)&PTR__HDD_001dc370;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<HDFHDD*>
              (a_Stack_40,(HDFHDD *)this_00);
    _Var5._M_pi = a_Stack_40[0]._M_pi;
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->h;
    this->_vptr_HDD = (_func_int **)this_00;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->h = _Var5._M_pi;
    _Var5._M_pi = extraout_RDX_00;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      _Var5._M_pi = extraout_RDX_01;
    }
    if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
      _Var5._M_pi = extraout_RDX_02;
    }
  }
  pp_Var2 = this->_vptr_HDD;
  if (pp_Var2 != (_func_int **)0x0) {
    cVar4 = (**(code **)(*pp_Var2 + 0x40))(pp_Var2,path,llTotalBytes_,pIdentify_,fOverwrite_);
    _Var5._M_pi = extraout_RDX_03;
    if (cVar4 == '\0') {
      p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->h;
      this->_vptr_HDD = (_func_int **)0x0;
      this->h = 0;
      this->cyls = 0;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
        _Var5._M_pi = extraout_RDX_04;
      }
    }
  }
  sVar6.super___shared_ptr<HDD,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var5._M_pi;
  sVar6.super___shared_ptr<HDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<HDD>)sVar6.super___shared_ptr<HDD,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<HDD> HDD::CreateDisk(const std::string& path, int64_t llTotalBytes_, const IDENTIFYDEVICE* pIdentify_, bool fOverwrite_)
{
    std::shared_ptr<HDD> hdd;

    if (IsHddImage(path))
        hdd = std::shared_ptr<HDD>(new HDFHDD());

    if (hdd && !hdd->Create(path, llTotalBytes_, pIdentify_, fOverwrite_))
        hdd.reset();

    return hdd;
}